

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_>::duplicate
          (holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_> *this)

{
  holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>&>
                     ((allocator_type<cs_impl::any::holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>,64ul,cs_impl::default_allocator_provider>
                       *)holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>::
                         allocator,&this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}